

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

string * __thiscall
chaiscript::eval::Fun_Call_AST_Node::pretty_print_abi_cxx11_(Fun_Call_AST_Node *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  string *in_RDI;
  shared_ptr<chaiscript::AST_Node> *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *__range2;
  int count;
  ostringstream oss;
  string *__lhs;
  string local_1d0 [32];
  reference local_1b0;
  shared_ptr<chaiscript::AST_Node> *local_1a8;
  __normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
  local_1a0;
  long local_198;
  int local_18c;
  ostringstream local_188 [392];
  
  __lhs = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_18c = 0;
  local_198 = in_RSI + 0x60;
  local_1a0._M_current =
       (shared_ptr<chaiscript::AST_Node> *)
       std::
       vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
       ::begin((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)in_RDI);
  local_1a8 = (shared_ptr<chaiscript::AST_Node> *)
              std::
              vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
              ::end((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                     *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                        *)__lhs,(__normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    local_1b0 = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                ::operator*(&local_1a0);
    peVar2 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25007f);
    (**peVar2->_vptr_AST_Node)(local_1d0);
    std::operator<<((ostream *)local_188,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    if (local_18c == 0) {
      std::operator<<((ostream *)local_188,"(");
    }
    local_18c = local_18c + 1;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
    ::operator++(&local_1a0);
  }
  std::operator<<((ostream *)local_188,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __lhs;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE 
        {
          std::ostringstream oss;

          int count = 0;
          for (const auto &child : this->children) {
            oss << child->pretty_print();

            if (count == 0)
            {
              oss << "(";
            }
            ++count;
          }

          oss << ")";

          return oss.str();
        }